

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.c
# Opt level: O0

int ThreadPoolShutdown(ThreadPool *tp)

{
  ThreadPoolJob *pTVar1;
  int iVar2;
  ListNode *pLVar3;
  ThreadPoolJob *temp;
  ListNode *head;
  ThreadPool *tp_local;
  
  if (tp == (ThreadPool *)0x0) {
    tp_local._4_4_ = 0x16;
  }
  else {
    pthread_mutex_lock((pthread_mutex_t *)tp);
    while ((tp->highJobQ).size != 0) {
      pLVar3 = ListHead(&tp->highJobQ);
      if (pLVar3 == (ListNode *)0x0) {
        pthread_mutex_unlock((pthread_mutex_t *)tp);
        return 0x16;
      }
      pTVar1 = (ThreadPoolJob *)pLVar3->item;
      if (pTVar1->free_func != (free_routine)0x0) {
        (*pTVar1->free_func)(pTVar1->arg);
      }
      FreeThreadPoolJob(tp,pTVar1);
      ListDelNode(&tp->highJobQ,pLVar3,0);
    }
    ListDestroy(&tp->highJobQ,0);
    while ((tp->medJobQ).size != 0) {
      pLVar3 = ListHead(&tp->medJobQ);
      if (pLVar3 == (ListNode *)0x0) {
        pthread_mutex_unlock((pthread_mutex_t *)tp);
        return 0x16;
      }
      pTVar1 = (ThreadPoolJob *)pLVar3->item;
      if (pTVar1->free_func != (free_routine)0x0) {
        (*pTVar1->free_func)(pTVar1->arg);
      }
      FreeThreadPoolJob(tp,pTVar1);
      ListDelNode(&tp->medJobQ,pLVar3,0);
    }
    ListDestroy(&tp->medJobQ,0);
    while ((tp->lowJobQ).size != 0) {
      pLVar3 = ListHead(&tp->lowJobQ);
      if (pLVar3 == (ListNode *)0x0) {
        pthread_mutex_unlock((pthread_mutex_t *)tp);
        return 0x16;
      }
      pTVar1 = (ThreadPoolJob *)pLVar3->item;
      if (pTVar1->free_func != (free_routine)0x0) {
        (*pTVar1->free_func)(pTVar1->arg);
      }
      FreeThreadPoolJob(tp,pTVar1);
      ListDelNode(&tp->lowJobQ,pLVar3,0);
    }
    ListDestroy(&tp->lowJobQ,0);
    if (tp->persistentJob != (ThreadPoolJob *)0x0) {
      pTVar1 = tp->persistentJob;
      if (pTVar1->free_func != (free_routine)0x0) {
        (*pTVar1->free_func)(pTVar1->arg);
      }
      FreeThreadPoolJob(tp,pTVar1);
      tp->persistentJob = (ThreadPoolJob *)0x0;
    }
    tp->shutdown = 1;
    pthread_cond_broadcast((pthread_cond_t *)&tp->condition);
    while (0 < tp->totalThreads) {
      pthread_cond_wait((pthread_cond_t *)&tp->start_and_shutdown,(pthread_mutex_t *)tp);
    }
    do {
      iVar2 = pthread_cond_destroy((pthread_cond_t *)&tp->condition);
    } while (iVar2 != 0);
    do {
      iVar2 = pthread_cond_destroy((pthread_cond_t *)&tp->start_and_shutdown);
    } while (iVar2 != 0);
    FreeListDestroy(&tp->jobFreeList);
    pthread_mutex_unlock((pthread_mutex_t *)tp);
    do {
      iVar2 = pthread_mutex_destroy((pthread_mutex_t *)tp);
    } while (iVar2 != 0);
    tp_local._4_4_ = 0;
  }
  return tp_local._4_4_;
}

Assistant:

int ThreadPoolShutdown(ThreadPool *tp)
{
	ListNode *head = NULL;
	ThreadPoolJob *temp = NULL;

	if (!tp)
		return EINVAL;
	ithread_mutex_lock(&tp->mutex);
	/* clean up high priority jobs */
	while (tp->highJobQ.size) {
		head = ListHead(&tp->highJobQ);
		if (head == NULL) {
			ithread_mutex_unlock(&tp->mutex);
			return EINVAL;
		}
		temp = (ThreadPoolJob *)head->item;
		if (temp->free_func)
			temp->free_func(temp->arg);
		FreeThreadPoolJob(tp, temp);
		ListDelNode(&tp->highJobQ, head, 0);
	}
	ListDestroy(&tp->highJobQ, 0);
	/* clean up med priority jobs */
	while (tp->medJobQ.size) {
		head = ListHead(&tp->medJobQ);
		if (head == NULL) {
			ithread_mutex_unlock(&tp->mutex);
			return EINVAL;
		}
		temp = (ThreadPoolJob *)head->item;
		if (temp->free_func)
			temp->free_func(temp->arg);
		FreeThreadPoolJob(tp, temp);
		ListDelNode(&tp->medJobQ, head, 0);
	}
	ListDestroy(&tp->medJobQ, 0);
	/* clean up low priority jobs */
	while (tp->lowJobQ.size) {
		head = ListHead(&tp->lowJobQ);
		if (head == NULL) {
			ithread_mutex_unlock(&tp->mutex);
			return EINVAL;
		}
		temp = (ThreadPoolJob *)head->item;
		if (temp->free_func)
			temp->free_func(temp->arg);
		FreeThreadPoolJob(tp, temp);
		ListDelNode(&tp->lowJobQ, head, 0);
	}
	ListDestroy(&tp->lowJobQ, 0);
	/* clean up long term job */
	if (tp->persistentJob) {
		temp = tp->persistentJob;
		if (temp->free_func)
			temp->free_func(temp->arg);
		FreeThreadPoolJob(tp, temp);
		tp->persistentJob = NULL;
	}
	/* signal shutdown */
	tp->shutdown = 1;
	ithread_cond_broadcast(&tp->condition);
	/* wait for all threads to finish */
	while (tp->totalThreads > 0)
		ithread_cond_wait(&tp->start_and_shutdown, &tp->mutex);
	/* destroy condition */
	while (ithread_cond_destroy(&tp->condition) != 0) {
	}
	while (ithread_cond_destroy(&tp->start_and_shutdown) != 0) {
	}
	FreeListDestroy(&tp->jobFreeList);

	ithread_mutex_unlock(&tp->mutex);

	/* destroy mutex */
	while (ithread_mutex_destroy(&tp->mutex) != 0) {
	}

	return 0;
}